

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall
soul::AST::TypeMetaFunction::checkSourceType(TypeMetaFunction *this,Type *sourceType)

{
  bool bVar1;
  
  switch(this->operation) {
  case makeConst:
    return (bool)(sourceType->isConstant ^ 1);
  case elementType:
    if ((sourceType->category & ~primitive) != vector) {
      return (sourceType->primitiveType).type - complex32 < 2;
    }
    break;
  case primitiveType:
    return sourceType->category != structure && sourceType->category != array;
  case size:
    bVar1 = canTakeSizeOf(sourceType);
    return bVar1;
  }
  return true;
}

Assistant:

bool checkSourceType (const Type& sourceType) const
        {
            if (operation == Op::size)           return canTakeSizeOf (sourceType);
            if (operation == Op::makeConst)      return ! sourceType.isConst();
            if (operation == Op::elementType)    return sourceType.isArrayOrVector() || sourceType.isComplex();
            if (operation == Op::primitiveType)  return ! (sourceType.isArray() || sourceType.isStruct());

            return true;
        }